

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::BinaryReader::BinaryReader(BinaryReader *this,istream *str)

{
  istream *piVar1;
  pointer puVar2;
  ostream *poVar3;
  runtime_error *this_00;
  int32_t formatTag;
  int32_t tag;
  uint64_t size;
  SP newEntity;
  uint local_48;
  undefined1 local_44 [4];
  size_type local_40;
  long *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->readEntities).
  super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->readEntities).
  super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->readEntities).
  super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->binStream = str;
  if (*(int *)(str + *(long *)(*(long *)str + -0x18) + 0x20) == 0) {
    std::istream::read((char *)str,(long)&local_48);
    if (local_48 != 9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Warning: pbf file uses a different format tag (",0x2f);
      poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,") than what this library is expecting (",0x27);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (0xffff < local_48) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "**** WARNING ***** : Even the *major* file format version is different - ",0x49)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "this means the file _should_ be incompatible with this library. ",0x40);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Please regenerate the pbf file.",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
      }
    }
    while( true ) {
      std::istream::read((char *)this->binStream,(long)&local_40);
      piVar1 = this->binStream;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) break;
      std::istream::read((char *)piVar1,(long)local_44);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->currentEntityData,local_40);
      std::istream::read((char *)this->binStream,
                         (long)(this->currentEntityData).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      this->currentEntityOffset = 0;
      createEntity((BinaryReader *)&stack0xffffffffffffffc8,(int)this);
      std::vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::
      push_back(&this->readEntities,(value_type *)&stack0xffffffffffffffc8);
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 0x10))(local_38,this);
      }
      puVar2 = (this->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->currentEntityData).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"invalid input stream - could not open file?");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryReader(std::istream &str)
      : binStream(str)
    {
      int32_t formatTag;
      if (!binStream.good())
        throw std::runtime_error("invalid input stream - could not open file?");
      binStream.read((char*)&formatTag,sizeof(formatTag));
      if (formatTag != ourFormatTag) {
        std::cout << "Warning: pbf file uses a different format tag ("
                  << ((int*)(size_t)formatTag) << ") than what this library is expecting ("
                  << ((int *)(size_t)ourFormatTag) << ")" << std::endl;
        int ourMajor = ourFormatTag >> 16;
        int fileMajor = formatTag >> 16;
        if (ourMajor != fileMajor)
          std::cout << "**** WARNING ***** : Even the *major* file format version is different - "
                    << "this means the file _should_ be incompatible with this library. "
                    << "Please regenerate the pbf file." << std::endl;
      }
      while (1) {
        uint64_t size;
        binStream.read((char*)&size,sizeof(size));
        if (!binStream.good())
          break;
        int32_t tag;
        binStream.read((char*)&tag,sizeof(tag));
        currentEntityData.resize(size);
        binStream.read((char *)currentEntityData.data(),size);
        currentEntityOffset = 0;

        Entity::SP newEntity = createEntity(tag);
        readEntities.push_back(newEntity);
        if (newEntity) newEntity->readFrom(*this);
        currentEntityData.clear();
      }
      // exit(0);
    }